

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

void Tas_ManSaveModel(Tas_Man_t *p,Vec_Int_t *vCex)

{
  Gia_Obj_t *pVar;
  undefined8 uVar1;
  uint uVar2;
  int Entry;
  long lVar3;
  
  vCex->nSize = 0;
  (p->pProp).iHead = 0;
  for (lVar3 = 0;
      (lVar3 < (p->pProp).iTail && (pVar = (p->pProp).pData[lVar3], pVar != (Gia_Obj_t *)0x0));
      lVar3 = lVar3 + 1) {
    uVar1 = *(undefined8 *)pVar;
    if ((~(uint)uVar1 & 0x9fffffff) == 0) {
      uVar2 = Tas_VarValue(pVar);
      Entry = Abc_Var2Lit((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff,uVar2 ^ 1);
      Vec_IntPush(vCex,Entry);
    }
  }
  return;
}

Assistant:

static inline void Tas_ManSaveModel( Tas_Man_t * p, Vec_Int_t * vCex )
{
    Gia_Obj_t * pVar;
    int i;
    Vec_IntClear( vCex );
    p->pProp.iHead = 0;
//    printf( "\n" );
    Tas_QueForEachEntry( p->pProp, pVar, i )
    {
        if ( Gia_ObjIsCi(pVar) )
//            Vec_IntPush( vCex, Abc_Var2Lit(Gia_ObjId(p->pAig,pVar), !Tas_VarValue(pVar)) );
            Vec_IntPush( vCex, Abc_Var2Lit(Gia_ObjCioId(pVar), !Tas_VarValue(pVar)) );
/*
        printf( "%5d(%d) = ", Gia_ObjId(p->pAig, pVar), Tas_VarValue(pVar) );
        if ( Gia_ObjIsCi(pVar) )
            printf( "pi %d\n", Gia_ObjCioId(pVar) );
        else
        {
            printf( "%5d %d  &  ", Gia_ObjFaninId0p(p->pAig, pVar), Gia_ObjFaninC0(pVar) );
            printf( "%5d %d     ", Gia_ObjFaninId1p(p->pAig, pVar), Gia_ObjFaninC1(pVar) );
            printf( "\n" );
        }
*/
    }
}